

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall re2::ByteMapBuilder::Mark(ByteMapBuilder *this,int lo,int hi)

{
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *unaff_retaddr;
  
  if ((in_ESI != 0) || (in_EDX != 0xff)) {
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              (unaff_retaddr,in_RDI,(int *)CONCAT44(in_ESI,in_EDX));
  }
  return;
}

Assistant:

void ByteMapBuilder::Mark(int lo, int hi) {
  DCHECK_GE(lo, 0);
  DCHECK_GE(hi, 0);
  DCHECK_LE(lo, 255);
  DCHECK_LE(hi, 255);
  DCHECK_LE(lo, hi);

  // Ignore any [0-255] ranges. They cause us to recolor every range, which
  // has no effect on the eventual result and is therefore a waste of time.
  if (lo == 0 && hi == 255)
    return;

  ranges_.emplace_back(lo, hi);
}